

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.cpp
# Opt level: O3

int __thiscall libchars::terminal_driver::shutdown(terminal_driver *this,int __fd,int __how)

{
  int in_EAX;
  int extraout_EAX;
  debug *this_00;
  double __x;
  
  if (-1 < this->fd_r) {
    if (this->is_tty == true) {
      ttyname(this->fd_r);
    }
    this_00 = debug::initialize(0);
    debug::log(this_00,__x);
    in_EAX = tcsetattr(this->fd_r,1,(termios *)this);
    this->fd_r = -1;
  }
  if (this->rbuf != (uint8_t *)0x0) {
    operator_delete__(this->rbuf);
    in_EAX = extraout_EAX;
  }
  this->rbuf = (uint8_t *)0x0;
  return in_EAX;
}

Assistant:

void terminal_driver::shutdown()
    {
        if (fd_r >= 0) {
            const char *term_tty_name = is_tty ? ttyname(fd_r) : "-";
            LC_LOG_DEBUG("RESTORE:%s",term_tty_name);
            // restore terminal settings
            (void)tcsetattr(fd_r, TCSADRAIN, &original_termios);
            fd_r = -1;
        }
        delete[] rbuf;
        rbuf = NULL;
    }